

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::SilentEntitySystem::~SilentEntitySystem(SilentEntitySystem *this)

{
  ~SilentEntitySystem(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

SilentEntitySystem::~SilentEntitySystem()
{
    m_vEA.clear();
}